

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O3

void visitElement(TransferElement *element,QColorVector *buffer,qsizetype len)

{
  Type TVar1;
  float *pfVar2;
  float fVar3;
  
  if (0 < len) {
    TVar1 = element->trc[3].m_type;
    pfVar2 = &buffer->w;
    do {
      fVar3 = QColorTrc::apply(element->trc,((QColorVector *)(pfVar2 + -3))->x);
      ((QColorVector *)(pfVar2 + -3))->x = fVar3;
      fVar3 = QColorTrc::apply(element->trc + 1,pfVar2[-2]);
      pfVar2[-2] = fVar3;
      fVar3 = QColorTrc::apply(element->trc + 2,pfVar2[-1]);
      pfVar2[-1] = fVar3;
      if (TVar1 != Uninitialized) {
        fVar3 = QColorTrc::apply(element->trc + 3,*pfVar2);
        *pfVar2 = fVar3;
      }
      pfVar2 = pfVar2 + 4;
      len = len + -1;
    } while (len != 0);
  }
  return;
}

Assistant:

static void visitElement(const QColorSpacePrivate::TransferElement &element, QColorVector *buffer, const qsizetype len)
{
    const bool doW = element.trc[3].isValid();
    for (qsizetype i = 0; i < len; ++i) {
        buffer[i].x = element.trc[0].apply(buffer[i].x);
        buffer[i].y = element.trc[1].apply(buffer[i].y);
        buffer[i].z = element.trc[2].apply(buffer[i].z);
        if (doW)
            buffer[i].w = element.trc[3].apply(buffer[i].w);
    }
}